

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport-sysfs-gpio.c
# Opt level: O3

int gpio_open(aura_node *node,char *opts)

{
  aura_export_table *tbl;
  
  slog(0,2,"Opening sysfs/gpio transport");
  tbl = aura_etable_create(node,0x10);
  if (tbl != (aura_export_table *)0x0) {
    aura_etable_add(tbl,"write","33","");
    aura_etable_add(tbl,"read","3","3");
    aura_etable_add(tbl,"out","3","");
    aura_etable_add(tbl,"in","3","");
    aura_etable_add(tbl,"export","3","3");
    aura_etable_add(tbl,"watch","3","");
    aura_etable_add(tbl,"gpio_changed",(char *)0x0,"333");
    aura_etable_activate(tbl);
    aura_set_status(node,1);
    slog(0,2,"Opened sysfs/gpio transport");
    return 0;
  }
  BUG(node,"Failed to create etable");
}

Assistant:

static int gpio_open(struct aura_node *node, const char *opts)
{
	slog(0, SLOG_INFO, "Opening sysfs/gpio transport");
	struct aura_export_table *etbl = aura_etable_create(node, 16);
	if (!etbl)
		BUG(node, "Failed to create etable");
	aura_etable_add(etbl, "write", "33", "");
	aura_etable_add(etbl, "read", "3", "3");
	aura_etable_add(etbl, "out", "3", "");
	aura_etable_add(etbl, "in", "3", "");
	aura_etable_add(etbl, "export", "3", "3");
	aura_etable_add(etbl, "watch", "3", "");
	//Change notification
	aura_etable_add(etbl, "gpio_changed", NULL, "333");
	aura_etable_activate(etbl);
	aura_set_status(node, AURA_STATUS_ONLINE);
	slog(0, SLOG_INFO, "Opened sysfs/gpio transport");
	return 0;
}